

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::SPxBasisBase<double>::change
          (SPxBasisBase<double> *this,int i,SPxId *id,SVectorBase<double> *enterVec,
          SSVectorBase<double> *eta)

{
  SVectorBase<double> *pSVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Verbosity VVar6;
  SVectorBase<double> **ppSVar7;
  DataKey *pDVar8;
  SVectorBase<double> *in_RCX;
  DataKey *in_RDX;
  uint in_ESI;
  time_t *__timer;
  SPxBasisBase<double> *in_RDI;
  undefined8 in_R8;
  double extraout_XMM0_Qa;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  SPxException *F;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  _func_ostream_ptr_ostream_ptr *manip;
  SPxOut *_spxout;
  undefined4 local_88;
  Verbosity local_84 [11];
  undefined4 local_58;
  Verbosity local_54 [3];
  Verbosity local_48;
  Verbosity local_44 [3];
  double local_38;
  int local_30;
  int local_2c;
  undefined8 local_28;
  SVectorBase<double> *local_20;
  DataKey *local_18;
  uint local_c;
  
  in_RDI->lastidx = in_ESI;
  (in_RDI->lastin).super_DataKey = *in_RDX;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  bVar2 = SPxId::isValid((SPxId *)in_RDX);
  if ((bVar2) && (-1 < (int)local_c)) {
    iVar5 = in_RDI->nzCount;
    ppSVar7 = DataArray<const_soplex::SVectorBase<double>_*>::operator[](&in_RDI->matrix,local_c);
    iVar3 = SVectorBase<double>::size(*ppSVar7);
    iVar4 = SVectorBase<double>::size(local_20);
    pSVar1 = local_20;
    in_RDI->nzCount = (iVar5 - iVar3) + iVar4;
    ppSVar7 = DataArray<const_soplex::SVectorBase<double>_*>::operator[](&in_RDI->matrix,local_c);
    *ppSVar7 = pSVar1;
    pDVar8 = &DataArray<soplex::SPxId>::operator[](&in_RDI->theBaseId,local_c)->super_DataKey;
    (in_RDI->lastout).super_DataKey = *pDVar8;
    __timer = (time_t *)(ulong)local_c;
    pDVar8 = &DataArray<soplex::SPxId>::operator[](&in_RDI->theBaseId,local_c)->super_DataKey;
    *pDVar8 = *local_18;
    in_RDI->iterCount = in_RDI->iterCount + 1;
    in_RDI->updateCount = in_RDI->updateCount + 1;
    local_2c = iteration(in_RDI);
    local_30 = (*in_RDI->factor->_vptr_SLinSolver[3])();
    _spxout = (SPxOut *)&in_RDI->lastFill;
    SPxSolverBase<double>::time(in_RDI->theLP,__timer);
    manip = (_func_ostream_ptr_ostream_ptr *)&local_30;
    SPxOut::
    debug<soplex::SPxBasisBase<double>,_const_char_(&)[117],_int,_int_&,_int_&,_int_&,_int,_double_&,_double,_0>
              (in_RDI,(char (*) [117])
                      "factor_stats: iteration= {}, update= {}, total_update= {}, nonzero_B= {}, nonzero_LU= {}, factor_fill= {}, time= {}\n"
               ,&local_2c,&in_RDI->updateCount,&in_RDI->totalUpdateCount,&in_RDI->nzCount,
               (int *)manip,(double *)_spxout,&local_38);
    if ((in_RDI->factorized & 1U) == 0) {
      (*in_RDI->_vptr_SPxBasisBase[0xb])();
    }
    else {
      iVar5 = (*in_RDI->factor->_vptr_SLinSolver[3])();
      iVar3 = (*in_RDI->factor->_vptr_SLinSolver[4])();
      if ((double)iVar5 <= (double)(iVar3 + 1000) + (double)in_RDI->lastMem * in_RDI->memFactor) {
        iVar5 = (*in_RDI->factor->_vptr_SLinSolver[3])();
        if ((double)iVar5 <= in_RDI->lastFill * (double)in_RDI->nzCount) {
          if (in_RDI->lastNzCount < in_RDI->nzCount) {
            if ((in_RDI->spxout != (SPxOut *)0x0) &&
               (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
              local_54[2] = SPxOut::getVerbosity(in_RDI->spxout);
              local_54[1] = 5;
              (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_54 + 1);
              soplex::operator<<(_spxout,(char *)manip);
              soplex::operator<<(_spxout,(char *)manip);
              soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
              soplex::operator<<(_spxout,(char *)manip);
              soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
              soplex::operator<<(_spxout,(char *)manip);
              soplex::operator<<(_spxout,(double)manip);
              soplex::operator<<(_spxout,manip);
              (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_54 + 2);
            }
            (*in_RDI->_vptr_SPxBasisBase[0xb])();
          }
          else if (in_RDI->updateCount < in_RDI->maxUpdates) {
            (*in_RDI->factor->_vptr_SLinSolver[9])(in_RDI->factor,(ulong)local_c,local_20,local_28);
            in_RDI->totalUpdateCount = in_RDI->totalUpdateCount + 1;
            iVar5 = (*in_RDI->factor->_vptr_SLinSolver[1])();
            if ((iVar5 != 0) ||
               ((*in_RDI->factor->_vptr_SLinSolver[6])(), extraout_XMM0_Qa < in_RDI->minStab)) {
              if ((in_RDI->spxout != (SPxOut *)0x0) &&
                 (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
                local_84[0] = SPxOut::getVerbosity(in_RDI->spxout);
                local_88 = 5;
                (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_88);
                soplex::operator<<(_spxout,(char *)manip);
                soplex::operator<<(_spxout,(char *)manip);
                (*in_RDI->factor->_vptr_SLinSolver[6])();
                soplex::operator<<(_spxout,(double)manip);
                soplex::operator<<(_spxout,(char *)manip);
                soplex::operator<<(_spxout,(double)manip);
                soplex::operator<<(_spxout,manip);
                (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_84);
              }
              (*in_RDI->_vptr_SPxBasisBase[0xb])();
            }
          }
          else {
            if ((in_RDI->spxout != (SPxOut *)0x0) &&
               (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
              local_54[0] = SPxOut::getVerbosity(in_RDI->spxout);
              local_58 = 5;
              (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_58);
              soplex::operator<<(_spxout,(char *)manip);
              soplex::operator<<(_spxout,(char *)manip);
              soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
              soplex::operator<<(_spxout,(char *)manip);
              soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
              soplex::operator<<(_spxout,manip);
              (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_54);
            }
            (*in_RDI->_vptr_SPxBasisBase[0xb])();
          }
        }
        else {
          if ((in_RDI->spxout != (SPxOut *)0x0) &&
             (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
            local_44[0] = SPxOut::getVerbosity(in_RDI->spxout);
            local_48 = 5;
            (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_48);
            soplex::operator<<(_spxout,(char *)manip);
            soplex::operator<<(_spxout,(char *)manip);
            (*in_RDI->factor->_vptr_SLinSolver[3])();
            soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
            soplex::operator<<(_spxout,(char *)manip);
            soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
            soplex::operator<<(_spxout,(char *)manip);
            soplex::operator<<(_spxout,(double)manip);
            soplex::operator<<(_spxout,manip);
            (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_44);
          }
          (*in_RDI->_vptr_SPxBasisBase[0xb])();
        }
      }
      else {
        if ((in_RDI->spxout != (SPxOut *)0x0) &&
           (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar6)) {
          local_44[2] = SPxOut::getVerbosity(in_RDI->spxout);
          local_44[1] = INFO3;
          (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_44 + 1);
          soplex::operator<<(_spxout,(char *)manip);
          soplex::operator<<(_spxout,(char *)manip);
          (*in_RDI->factor->_vptr_SLinSolver[3])();
          soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
          soplex::operator<<(_spxout,(char *)manip);
          soplex::operator<<(_spxout,(int)((ulong)manip >> 0x20));
          soplex::operator<<(_spxout,(char *)manip);
          soplex::operator<<(_spxout,(double)manip);
          soplex::operator<<(_spxout,manip);
          (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_44 + 2);
        }
        (*in_RDI->_vptr_SPxBasisBase[0xb])();
      }
    }
  }
  else {
    (in_RDI->lastout).super_DataKey = *local_18;
  }
  return;
}

Assistant:

void SPxBasisBase<R>::change(
   int i,
   SPxId& id,
   const SVectorBase<R>* enterVec,
   const SSVectorBase<R>* eta)
{

   assert(matrixIsSetup);
   assert(!id.isValid() || (enterVec != nullptr));
   assert(factor != nullptr);

   lastidx = i;
   lastin  = id;

   if(id.isValid() && i >= 0)
   {
      assert(enterVec != nullptr);

      // update the counter for nonzeros in the basis matrix
      nzCount      = nzCount - matrix[i]->size() + enterVec->size();
      // let the new id enter the basis
      matrix[i]    = enterVec;
      lastout      = theBaseId[i];
      theBaseId[i] = id;

      ++iterCount;
      ++updateCount;

      SPxOut::debug(this,
                    "factor_stats: iteration= {}, update= {}, total_update= {}, nonzero_B= {}, nonzero_LU= {}, factor_fill= {}, time= {}\n",
                    this->iteration(), updateCount, totalUpdateCount, nzCount, factor->memory(), lastFill,
                    theLP->time());

      // never factorize? Just do it !
      if(!factorized)
         factorize();

      // too much memory growth ?
      else if(R(factor->memory()) > 1000 + factor->dim() + lastMem * memFactor)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                       "IBASIS04 memory growth factor triggers refactorization"
                       << " memory= " << factor->memory()
                       << " lastMem= " << lastMem
                       << " memFactor= " << memFactor
                       << std::endl;)
         factorize();
      }

      // relative fill too high ?
      else if(R(factor->memory()) > lastFill * R(nzCount))
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS04 fill factor triggers refactorization"
                       << " memory= " << factor->memory()
                       << " nzCount= " << nzCount
                       << " lastFill= " << lastFill
                       << std::endl;)

         factorize();
      }
      // absolute fill in basis matrix too high ?
      else if(nzCount > lastNzCount)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS05 nonzero factor triggers refactorization"
                       << " nzCount= " << nzCount
                       << " lastNzCount= " << lastNzCount
                       << " nonzeroFactor= " << nonzeroFactor
                       << std::endl;)
         factorize();
      }
      // too many updates ?
      else if(updateCount >= maxUpdates)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS06 update count triggers refactorization"
                       << " updateCount= " << updateCount
                       << " maxUpdates= " << maxUpdates
                       << std::endl;)
         factorize();
      }
      else
      {
         try
         {
#ifdef MEASUREUPDATETIME
            theTime.start();
#endif
            factor->change(i, *enterVec, eta);
            totalUpdateCount++;
#ifdef MEASUREUPDATETIME
            theTime.stop();
#endif
         }
         catch(...)
         {
            SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                          "IBASIS13 problems updating factorization; refactorizing basis"
                          << std::endl;)

#ifdef MEASUREUPDATETIME
            theTime.stop();
#endif

            // singularity was detected in update; we refactorize
            factorize();

            // if factorize() detects singularity, an exception is thrown, hence at this point we have a regular basis
            // and can try the update again
            assert(status() >= SPxBasisBase<R>::REGULAR);

            try
            {
#ifdef MEASUREUPDATETIME
               theTime.start();
#endif
               factor->change(i, *enterVec, eta);
               totalUpdateCount++;
#ifdef MEASUREUPDATETIME
               theTime.stop();
#endif
            }
            // with a freshly factorized, regular basis, the update is unlikely to fail; if this happens nevertheless,
            // we have to invalidate the basis to have the statuses correct
            catch(const SPxException& F)
            {
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                             "IBASIS14 problems updating factorization; invalidating factorization"
                             << std::endl;)

#ifdef MEASUREUPDATETIME
               theTime.stop();
#endif

               factorized = false;
               throw F;
            }
         }

         assert(minStab > 0.0);

         if(factor->status() != SLinSolver<R>::OK || factor->stability() < minStab)
         {
            SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS07 stability triggers refactorization"
                          << " stability= " << factor->stability()
                          << " minStab= " << minStab
                          << std::endl;)
            factorize();
         }
      }
   }
   else
      lastout = id;
}